

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseClient.cpp
# Opt level: O1

bool __thiscall
xmrig::BaseClient::handleResponse(BaseClient *this,int64_t id,Value *result,Value *error)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  BaseClient *pBVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  iterator __position;
  iterator __position_00;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined1 local_31;
  long local_30;
  
  if (id == 1) {
    bVar6 = false;
  }
  else {
    p_Var1 = &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    pBVar5 = this;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(long)pBVar5]) {
      pBVar5 = (BaseClient *)(ulong)(*(long *)(p_Var2 + 1) < id);
      if (id <= *(long *)(p_Var2 + 1)) {
        p_Var4 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (__position._M_node = p_Var4, id < *(long *)(p_Var4 + 1))) {
      __position._M_node = &p_Var1->_M_header;
    }
    bVar6 = (_Rb_tree_header *)__position._M_node != p_Var1;
    if (bVar6) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_30 = lVar3 / 1000000 - (long)__position._M_node[2]._M_parent;
      local_31 = (error->data_).f.flags != 3;
      if ((bool)local_31) {
        p_Var2 = __position._M_node[1]._M_right;
      }
      else {
        p_Var2 = __position._M_node[1]._M_right;
        result = error;
      }
      if (p_Var2 == (_Base_ptr)0x0) {
        auVar7 = std::__throw_bad_function_call();
        uVar8 = auVar7._0_8_;
        p_Var1 = &(pBVar5->m_results)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (pBVar5->m_results)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 = &p_Var1->_M_header;
        for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < id]) {
          if (id <= *(long *)(p_Var2 + 1)) {
            p_Var4 = p_Var2;
          }
        }
        __position_00._M_node = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
           (__position_00._M_node = p_Var4, id < *(long *)(p_Var4 + 1))) {
          __position_00._M_node = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
          lVar3 = std::chrono::_V2::steady_clock::now();
          __position_00._M_node[2]._M_left =
               (_Base_ptr)(lVar3 / 1000000 - (long)__position_00._M_node[2]._M_right);
          (*pBVar5->m_listener->_vptr_IClientListener[6])
                    (pBVar5->m_listener,pBVar5,&__position_00._M_node[1]._M_parent,auVar7._8_8_,
                     in_R8,in_R9,uVar8,this,__position._M_node);
          std::
          _Rb_tree<long,std::pair<long_const,xmrig::SubmitResult>,std::_Select1st<std::pair<long_const,xmrig::SubmitResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::SubmitResult>>>
          ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,xmrig::SubmitResult>,std::_Select1st<std::pair<long_const,xmrig::SubmitResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::SubmitResult>>>
                              *)&pBVar5->m_results,__position_00);
        }
        return (_Rb_tree_header *)__position_00._M_node != p_Var1;
      }
      (**(code **)(__position._M_node + 2))
                (&__position._M_node[1]._M_parent,result,&local_31,&local_30);
      std::
      _Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,xmrig::BaseClient::SendResult>,std::_Select1st<std::pair<long_const,xmrig::BaseClient::SendResult>>,std::less<long>,std::allocator<std::pair<long_const,xmrig::BaseClient::SendResult>>>
                          *)&this->m_callbacks,__position);
    }
  }
  return bVar6;
}

Assistant:

bool xmrig::BaseClient::handleResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == 1) {
        return false;
    }

    auto it = m_callbacks.find(id);
    if (it != m_callbacks.end()) {
        const uint64_t elapsed = Chrono::steadyMSecs() - it->second.ts;

        if (error.IsObject()) {
            it->second.callback(error, false, elapsed);
        }
        else {
            it->second.callback(result, true, elapsed);
        }

        m_callbacks.erase(it);

        return true;
    }

    return false;
}